

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

int haar_ac_sad(tran_low_t *output,int bw,int bh,int stride)

{
  int iVar1;
  int c;
  int r;
  int acsad;
  int stride_local;
  int bh_local;
  int bw_local;
  tran_low_t *output_local;
  
  acsad = 0;
  for (r = 0; r < bh; r = r + 1) {
    for (c = 0; c < bw; c = c + 1) {
      if ((bh / 2 <= r) || (bw / 2 <= c)) {
        iVar1 = output[r * stride + c];
        if (iVar1 < 1) {
          iVar1 = -iVar1;
        }
        acsad = iVar1 + acsad;
      }
    }
  }
  return acsad;
}

Assistant:

static int haar_ac_sad(const tran_low_t *output, int bw, int bh, int stride) {
  int acsad = 0;

  for (int r = 0; r < bh; ++r)
    for (int c = 0; c < bw; ++c) {
      if (r >= bh / 2 || c >= bw / 2) acsad += abs(output[r * stride + c]);
    }
  return acsad;
}